

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O0

void nn_propagate_input_multiple_of_8
               (float *inputs,float *weights,float *bias,int num_inputs_to_process,
               int tot_num_inputs,_Bool is_output_layer,int num_outputs,float *output_nodes)

{
  uint uVar1;
  int in_ECX;
  int in_R8D;
  byte in_R9B;
  int in_stack_00000008;
  int is_clip_required;
  int in_stack_000000ec;
  int in_stack_000000f0;
  int in_stack_000000f4;
  float *in_stack_000000f8;
  float *in_stack_00000100;
  float *in_stack_00000108;
  int in_stack_00000164;
  int in_stack_00000168;
  int in_stack_0000016c;
  float *in_stack_00000170;
  float *in_stack_00000178;
  float *in_stack_00000180;
  int in_stack_0000022c;
  int in_stack_00000230;
  int in_stack_00000234;
  float *in_stack_00000238;
  float *in_stack_00000240;
  float *in_stack_00000248;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  bool local_29;
  
  local_29 = (in_R9B & 1) == 0 && in_ECX == in_R8D;
  uVar1 = (uint)local_29;
  if (in_stack_00000008 % 8 == 0) {
    nn_propagate_8to8(in_stack_00000248,in_stack_00000240,in_stack_00000238,in_stack_00000234,
                      in_stack_00000230,in_stack_0000022c,
                      (float *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),in_stack_ffffffffffffffc8);
  }
  else if (in_stack_00000008 % 4 == 0) {
    nn_propagate_8to4(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_0000016c,
                      in_stack_00000168,in_stack_00000164,
                      (float *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),in_stack_ffffffffffffffc8);
  }
  else {
    nn_propagate_8to1(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4,
                      in_stack_000000f0,in_stack_000000ec,
                      (float *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static inline void nn_propagate_input_multiple_of_8(
    const float *const inputs, const float *const weights,
    const float *const bias, int num_inputs_to_process, int tot_num_inputs,
    bool is_output_layer, int num_outputs, float *const output_nodes) {
  // The saturation of output is considered for hidden layer which is not equal
  // to final hidden layer.
  const int is_clip_required =
      !is_output_layer && num_inputs_to_process == tot_num_inputs;
  if (num_outputs % 8 == 0) {
    nn_propagate_8to8(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  } else if (num_outputs % 4 == 0) {
    nn_propagate_8to4(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  } else {
    nn_propagate_8to1(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  }
}